

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

void __thiscall QToolBar::setOrientation(QToolBar *this,Orientation orientation)

{
  long lVar1;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(Orientation *)(lVar1 + 0x25c) != orientation) {
    *(Orientation *)(lVar1 + 0x25c) = orientation;
    policy.data = 0x50000;
    if (orientation == Vertical) {
      policy.data = 0x500000;
    }
    QWidget::setSizePolicy(&this->super_QWidget,(QSizePolicy)policy);
    (**(code **)(**(long **)(lVar1 + 0x278) + 0x70))();
    QLayout::activate(*(QLayout **)(lVar1 + 0x278));
    local_2c = *(undefined4 *)(lVar1 + 0x25c);
    puStack_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::setOrientation(Qt::Orientation orientation)
{
    Q_D(QToolBar);
    if (orientation == d->orientation)
        return;

    d->orientation = orientation;

    if (orientation == Qt::Vertical)
        setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Preferred));
    else
        setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed));

    d->layout->invalidate();
    d->layout->activate();

    emit orientationChanged(d->orientation);
}